

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_subdiv_mesh.cpp
# Opt level: O2

void __thiscall
embree::sse2::SubdivMeshISA::interpolateN(SubdivMeshISA *this,RTCInterpolateNArguments *args)

{
  int *piVar1;
  float *pfVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  RawBufferView *pRVar6;
  void *pvVar7;
  uint *puVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  pointer pvVar17;
  char *pcVar18;
  long lVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  longlong lVar24;
  longlong lVar25;
  int iVar26;
  uint uVar27;
  uint uVar28;
  float *pfVar29;
  reference entry;
  ulong uVar30;
  uint uVar31;
  vector<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
  *pvVar32;
  ulong stride;
  float *ddPdudv;
  ulong uVar33;
  float *dPdv;
  Topology *pTVar34;
  float *dPdu;
  float *ddPdudu;
  float *ddPdvdv;
  size_t N;
  undefined1 auVar35 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  size_t slots;
  uint local_e8;
  uint uStack_e4;
  uint uStack_e0;
  uint uStack_dc;
  uint local_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  vfloat4 vv;
  vfloat4 uu;
  vuint4 primID;
  vboolf_impl<4> valid2;
  PatchEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
  local_70;
  
  uVar3 = args->N;
  uVar4 = args->bufferSlot;
  if (args->bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) {
    pRVar6 = (this->super_SubdivMesh).vertexAttribs.items;
    pvVar32 = &(this->super_SubdivMesh).vertex_attrib_buffer_tags;
    pTVar34 = (this->super_SubdivMesh).topology.items + pRVar6[uVar4].userData;
  }
  else {
    pRVar6 = &((this->super_SubdivMesh).vertices.items)->super_RawBufferView;
    pvVar32 = &(this->super_SubdivMesh).vertex_buffer_tags;
    pTVar34 = (this->super_SubdivMesh).topology.items;
  }
  pvVar7 = args->valid;
  puVar8 = args->primIDs;
  pfVar9 = args->u;
  pfVar10 = args->v;
  pfVar11 = args->P;
  pfVar12 = args->dPdu;
  pfVar13 = args->dPdv;
  pfVar14 = args->ddPdudu;
  pfVar15 = args->ddPdvdv;
  pfVar16 = args->ddPdudv;
  pvVar17 = (pvVar32->
            super__Vector_base<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar5 = args->valueCount;
  stride = (ulong)(uint)pRVar6[uVar4].stride;
  pcVar18 = pRVar6[uVar4].ptr_ofs;
  for (uVar30 = 0; uVar30 < uVar3; uVar30 = uVar30 + 4) {
    uVar27 = (uint)uVar30;
    if (pvVar7 == (void *)0x0) {
      bVar20 = (int)uVar27 < (int)uVar3;
      bVar21 = (int)(uVar27 | 1) < (int)uVar3;
      bVar22 = (int)(uVar27 | 2) < (int)uVar3;
      bVar23 = (int)(uVar27 | 3) < (int)uVar3;
    }
    else {
      piVar1 = (int *)((long)pvVar7 + uVar30 * 4);
      bVar20 = *piVar1 == -1 && (int)uVar27 < (int)uVar3;
      bVar21 = piVar1[1] == -1 && (int)(uVar27 | 1) < (int)uVar3;
      bVar22 = piVar1[2] == -1 && (int)(uVar27 | 2) < (int)uVar3;
      bVar23 = piVar1[3] == -1 && (int)(uVar27 | 3) < (int)uVar3;
    }
    auVar37._0_4_ = (uint)bVar20 * -0x80000000;
    auVar37._4_4_ = (uint)bVar21 * -0x80000000;
    auVar37._8_4_ = (uint)bVar22 * -0x80000000;
    auVar37._12_4_ = (uint)bVar23 * -0x80000000;
    iVar26 = movmskps((int)pvVar7,auVar37);
    if (iVar26 != 0) {
      auVar38._0_4_ = auVar37._0_4_ >> 0x1f;
      auVar38._4_4_ = auVar37._4_4_ >> 0x1f;
      auVar38._8_4_ = auVar37._8_4_ >> 0x1f;
      auVar38._12_4_ = auVar37._12_4_ >> 0x1f;
      lVar24 = *(longlong *)(puVar8 + uVar30);
      lVar25 = *(longlong *)(puVar8 + uVar30 + 2);
      primID.field_0.v[0] = lVar24;
      primID.field_0.v[1] = lVar25;
      uu.field_0._0_8_ = *(undefined8 *)(pfVar9 + uVar30);
      uu.field_0._8_8_ = *(undefined8 *)(pfVar9 + uVar30 + 2);
      vv.field_0._0_8_ = *(undefined8 *)(pfVar10 + uVar30);
      vv.field_0._8_8_ = *(undefined8 *)(pfVar10 + uVar30 + 2);
      pfVar2 = pfVar16 + uVar30;
      pfVar29 = pfVar2;
      while (uVar27 = movmskps((int)pfVar29,auVar38), uVar27 != 0) {
        lVar19 = 0;
        if ((uVar27 & 0xff) != 0) {
          for (; ((uVar27 & 0xff) >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
          }
        }
        uVar27 = primID.field_0.i[(int)lVar19];
        local_e8 = (uint)lVar24;
        uStack_e4 = (uint)((ulong)lVar24 >> 0x20);
        uStack_e0 = (uint)lVar25;
        uStack_dc = (uint)((ulong)lVar25 >> 0x20);
        auVar35._0_4_ = -(uint)(uVar27 == local_e8);
        auVar35._4_4_ = -(uint)(uVar27 == uStack_e4);
        auVar35._8_4_ = -(uint)(uVar27 == uStack_e0);
        auVar35._12_4_ = -(uint)(uVar27 == uStack_dc);
        aVar36 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar35 & auVar38);
        valid2.field_0 = aVar36;
        uVar33 = 0;
        uVar28 = uVar5;
        for (uVar31 = 0; pfVar29 = (float *)(ulong)uVar28, uVar31 < uVar5; uVar31 = uVar31 + 4) {
          N = 4;
          if (uVar28 < 4) {
            N = (size_t)uVar28;
          }
          entry = std::
                  vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>
                  ::at(pvVar17 + uVar4,(ulong)(uVar31 >> 2) + (stride + 0xf >> 4) * (ulong)uVar27);
          pfVar29 = pfVar11 + uVar30 + uVar33;
          if (pfVar11 == (float *)0x0) {
            pfVar29 = (float *)0x0;
          }
          dPdu = pfVar12 + uVar30 + uVar33;
          if (pfVar12 == (float *)0x0) {
            dPdu = (float *)0x0;
          }
          dPdv = pfVar13 + uVar30 + uVar33;
          if (pfVar13 == (float *)0x0) {
            dPdv = (float *)0x0;
          }
          ddPdudu = pfVar14 + uVar30 + uVar33;
          if (pfVar14 == (float *)0x0) {
            ddPdudu = (float *)0x0;
          }
          ddPdvdv = pfVar15 + uVar30 + uVar33;
          if (pfVar15 == (float *)0x0) {
            ddPdvdv = (float *)0x0;
          }
          ddPdudv = pfVar2 + uVar33;
          if (pfVar16 == (float *)0x0) {
            ddPdudv = (float *)0x0;
          }
          PatchEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
          ::PatchEvalSimd(&local_70,entry,(this->super_SubdivMesh).commitCounter,
                          (pTVar34->halfEdges).items + (pTVar34->mesh->faceStartEdge).items[uVar27],
                          pcVar18 + (ulong)uVar31 * 4,stride,&valid2,&uu,&vv,pfVar29,dPdu,dPdv,
                          ddPdudu,ddPdvdv,ddPdudv,(ulong)uVar3,N);
          uVar33 = (ulong)((int)uVar33 + uVar3 * 4);
          uVar28 = uVar28 - 4;
        }
        local_d8 = aVar36.i[0];
        uStack_d4 = aVar36.i[1];
        uStack_d0 = aVar36.i[2];
        uStack_cc = aVar36.i[3];
        auVar39._0_4_ = auVar38._0_4_ ^ local_d8;
        auVar39._4_4_ = auVar38._4_4_ ^ uStack_d4;
        auVar39._8_4_ = auVar38._8_4_ ^ uStack_d0;
        auVar39._12_4_ = auVar38._12_4_ ^ uStack_cc;
        auVar38 = auVar39;
      }
    }
  }
  return;
}

Assistant:

void SubdivMeshISA::interpolateN(const RTCInterpolateNArguments* const args)
    {
      const void* valid_i = args->valid;
      const unsigned* primIDs = args->primIDs;
      const float* u = args->u;
      const float* v = args->v;
      unsigned int N = args->N;
      RTCBufferType bufferType = args->bufferType;
      unsigned int bufferSlot = args->bufferSlot;
      float* P = args->P;
      float* dPdu = args->dPdu;
      float* dPdv = args->dPdv;
      float* ddPdudu = args->ddPdudu;
      float* ddPdvdv = args->ddPdvdv;
      float* ddPdudv = args->ddPdudv;
      unsigned int valueCount = args->valueCount;
    
      /* calculate base pointer and stride */
      assert((bufferType == RTC_BUFFER_TYPE_VERTEX && bufferSlot < RTC_MAX_TIME_STEP_COUNT) ||
             (bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE && bufferSlot < RTC_MAX_USER_VERTEX_BUFFERS));
      const char* src = nullptr; 
      size_t stride = 0;
      std::vector<SharedLazyTessellationCache::CacheEntry>* baseEntry = nullptr;
      Topology* topo = nullptr;
      if (bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) {
        assert(bufferSlot < vertexAttribs.size());
        src    = vertexAttribs[bufferSlot].getPtr();
        stride = vertexAttribs[bufferSlot].getStride();
        baseEntry = &vertex_attrib_buffer_tags[bufferSlot];
        int topologyID = vertexAttribs[bufferSlot].userData;
        topo = &topology[topologyID];
      } else {
        assert(bufferSlot < numTimeSteps);
        src    = vertices[bufferSlot].getPtr();
        stride = vertices[bufferSlot].getStride();
        baseEntry = &vertex_buffer_tags[bufferSlot];
        topo = &topology[0];
      }
      
      const int* valid = (const int*) valid_i;
      
      for (size_t i=0; i<N; i+=4) 
      {
        vbool4 valid1 = vint4(int(i))+vint4(step) < vint4(int(N));
        if (valid) valid1 &= vint4::loadu(&valid[i]) == vint4(-1);
        if (none(valid1)) continue;
        
        const vuint4 primID = vuint4::loadu(&primIDs[i]);
        const vfloat4 uu = vfloat4::loadu(&u[i]);
        const vfloat4 vv = vfloat4::loadu(&v[i]);
        
        foreach_unique(valid1,primID,[&](const vbool4& valid1, const unsigned int primID)
                       {
                         for (unsigned int j=0; j<valueCount; j+=4) 
                         {
                           const size_t M = min(4u,valueCount-j);
                           isa::PatchEvalSimd<vbool4,vint4,vfloat4,vfloat4>(baseEntry->at(interpolationSlot(primID,j/4,stride)),commitCounter,
                                                                            topo->getHalfEdge(primID),src+j*sizeof(float),stride,valid1,uu,vv,
                                                                            P ? P+j*N+i : nullptr,
                                                                            dPdu ? dPdu+j*N+i : nullptr,
                                                                            dPdv ? dPdv+j*N+i : nullptr,
                                                                            ddPdudu ? ddPdudu+j*N+i : nullptr,
                                                                            ddPdvdv ? ddPdvdv+j*N+i : nullptr,
                                                                            ddPdudv ? ddPdudv+j*N+i : nullptr,
                                                                            N,M);
                         }
                       });
      }
    }